

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassFactoryRegistry.cpp
# Opt level: O3

ClassFactoryRegistry * Lodtalk::ClassFactoryRegistry::get(void)

{
  ClassFactoryRegistry *this;
  
  if (uniqueInstance == (ClassFactoryRegistry *)0x0) {
    this = (ClassFactoryRegistry *)operator_new(0x38);
    ClassFactoryRegistry(this);
    uniqueInstance = this;
  }
  return uniqueInstance;
}

Assistant:

ClassFactoryRegistry *ClassFactoryRegistry::get()
{
    if(!uniqueInstance)
        uniqueInstance = new ClassFactoryRegistry();
    return uniqueInstance;
}